

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit.cpp
# Opt level: O3

void commit(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  FILE *pFVar4;
  EVP_PKEY_CTX *pEVar5;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  long lVar10;
  string dest;
  string destination_dir;
  string new_hash;
  string source;
  string seed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string time;
  GlobalConfig globalConfig;
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  string old_hash;
  string msg;
  string str;
  EVP_PKEY_CTX *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140;
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100;
  undefined1 local_f0 [16];
  vector<FileStatus,_std::allocator<FileStatus>_> local_e0;
  vector<FileStatus,_std::allocator<FileStatus>_> local_c8;
  string local_b0;
  undefined1 *local_90;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  stageStatus();
  if (local_c8.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puts("Nothing to commit");
    exit(0);
  }
  if (0 < argc) {
    std::__cxx11::string::string((string *)&local_70,*argv,(allocator *)local_120);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::vector(&local_e0,&local_c8);
    strStatus_abi_cxx11_(&local_50,&local_e0);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_e0);
    getGlobalConfig();
    getTime_abi_cxx11_();
    last_commit_hash_abi_cxx11_();
    std::operator+(&local_1b8,&local_70,&local_50);
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_120[0]);
    local_218 = (EVP_PKEY_CTX *)&local_208;
    pEVar5 = (EVP_PKEY_CTX *)(plVar2 + 2);
    if ((EVP_PKEY_CTX *)*plVar2 == pEVar5) {
      local_208 = *(long *)pEVar5;
      lStack_200 = plVar2[3];
    }
    else {
      local_208 = *(long *)pEVar5;
      local_218 = (EVP_PKEY_CTX *)*plVar2;
    }
    local_210 = plVar2[1];
    *plVar2 = (long)pEVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_100);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1e8 = *plVar6;
      lStack_1e0 = plVar2[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar6;
      local_1f8 = (long *)*plVar2;
    }
    local_1f0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_140);
    psVar7 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar2[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_1d8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_90);
    local_198 = &local_188;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_188 = *plVar6;
      lStack_180 = plVar2[3];
    }
    else {
      local_188 = *plVar6;
      local_198 = (long *)*plVar2;
    }
    local_190 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_218 != (EVP_PKEY_CTX *)&local_208) {
      operator_delete(local_218);
    }
    paVar1 = &local_1b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_198,local_190 + (long)local_198);
    hash(&local_1d8,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_218 = (EVP_PKEY_CTX *)&local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
               COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)&local_218);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_218,(ulong)local_1d8._M_dataplus._M_p);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1e8 = *plVar6;
      lStack_1e0 = plVar2[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar6;
      local_1f8 = (long *)*plVar2;
    }
    local_1f0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_218 != (EVP_PKEY_CTX *)&local_208) {
      operator_delete(local_218);
    }
    mkdir((char *)local_1f8,0x1ff);
    ls_abi_cxx11_(&local_178,STAGE_DIR_abi_cxx11_._M_dataplus._M_p);
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar10 = 8;
      uVar9 = 0;
      do {
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_1f8,(long)local_1f8 + local_1f0);
        std::__cxx11::string::append((char *)&local_1b8);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1b8,
                            *(ulong *)((long)local_178.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8
                                      ));
        local_218 = (EVP_PKEY_CTX *)&local_208;
        pEVar5 = (EVP_PKEY_CTX *)(puVar3 + 2);
        if ((EVP_PKEY_CTX *)*puVar3 == pEVar5) {
          local_208 = *(long *)pEVar5;
          lStack_200 = puVar3[3];
        }
        else {
          local_208 = *(long *)pEVar5;
          local_218 = (EVP_PKEY_CTX *)*puVar3;
        }
        local_210 = puVar3[1];
        *puVar3 = pEVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        local_160[0] = local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_160,STAGE_DIR_abi_cxx11_._M_dataplus._M_p,
                   STAGE_DIR_abi_cxx11_._M_dataplus._M_p + STAGE_DIR_abi_cxx11_._M_string_length);
        std::__cxx11::string::append((char *)local_160);
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_160,
                                    *(ulong *)((long)local_178.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar10 + -8));
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 == paVar8) {
          local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_1b8.field_2._8_8_ = plVar2[3];
          local_1b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_1b8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_1b8._M_string_length = plVar2[1];
        *plVar2 = (long)paVar8;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if (local_160[0] != local_150) {
          operator_delete(local_160[0]);
        }
        copy((EVP_PKEY_CTX *)local_1b8._M_dataplus._M_p,local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_218 != (EVP_PKEY_CTX *)&local_208) {
          operator_delete(local_218);
        }
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar9 < (ulong)((long)local_178.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_178.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    pFVar4 = fopen(HEAD_abi_cxx11_._M_dataplus._M_p,"a");
    fprintf(pFVar4,"%s\n",local_1d8._M_dataplus._M_p);
    fclose(pFVar4);
    pFVar4 = fopen(LOG_abi_cxx11_._M_dataplus._M_p,"a");
    fwrite("------------\n",0xd,1,pFVar4);
    fprintf(pFVar4,"Hash: %s\n",local_1d8._M_dataplus._M_p);
    fprintf(pFVar4,"Msg: %s\n",local_70._M_dataplus._M_p);
    fprintf(pFVar4,"Create by name:%s email:%s\n",local_120[0],local_100);
    fprintf(pFVar4,"On:%s\n\n",local_140);
    fclose(pFVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_140 != local_130) {
      operator_delete(local_140);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100);
    }
    if (local_120[0] != local_110) {
      operator_delete(local_120[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_c8);
    return;
  }
  puts("Need commit msg");
  exit(1);
}

Assistant:

void commit(int argc, char *argv[]){
    Vector<FileStatus> status = stageStatus();
    if(status.size()==0){
        printf("Nothing to commit\n");
        exit(EXIT_SUCCESS);
    }
    if(argc <1){
        printf("Need commit msg\n");
        exit(EXIT_FAILURE);
    }
    String msg = argv[0];
    String str = strStatus(status);
    GlobalConfig globalConfig = getGlobalConfig();
    String time = getTime();
    String old_hash = last_commit_hash();
    String seed = msg + str + globalConfig.name + globalConfig.email + time + old_hash;
    String new_hash = hash(seed);
    String destination_dir = COMMITS_DIR + "/" + new_hash;

    mkdir(destination_dir.c_str(),DEFAULT_PERM);
    Vector<String> files = ls(STAGE_DIR.c_str());
    for(int i = 0; i < files.size();i++){
        String dest = destination_dir + "/" + files[i];
        String source = STAGE_DIR + "/" + files[i];
        copy(source.c_str(),dest.c_str());
    }
    FILE * file = fopen(HEAD.c_str(),"a");
    fprintf(file,"%s\n",new_hash.c_str());
    fclose(file);
    file = fopen(LOG.c_str(),"a");

    fprintf(file,"------------\n");
    fprintf(file,"Hash: %s\n",new_hash.c_str());
    fprintf(file,"Msg: %s\n",msg.c_str());
    fprintf(file,"Create by name:%s email:%s\n",globalConfig.name.c_str(),globalConfig.email.c_str());
    fprintf(file,"On:%s\n\n",time.c_str());
    fclose(file);
}